

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.h
# Opt level: O2

void __thiscall FIX::MemoryStore::reset(MemoryStore *this)

{
  this->m_nextSenderMsgSeqNum = 1;
  this->m_nextTargetMsgSeqNum = 1;
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->m_messages)._M_t);
  UtcTimeStamp::setCurrent(&this->m_creationTime);
  return;
}

Assistant:

void reset() EXCEPT ( IOException )
  {
    m_nextSenderMsgSeqNum = 1; m_nextTargetMsgSeqNum = 1;
    m_messages.clear(); m_creationTime.setCurrent();
  }